

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int encode_short_constructor(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  uchar local_9;
  
  local_9 = 'a';
  iVar1 = (*encoder_output)(context,&local_9,1);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xb3f;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"encode_short_constructor",0xb3e,1,"Failed encoding short constructor");
    }
  }
  return iVar1;
}

Assistant:

static int encode_short_constructor(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_284: [<encoding code="0x61" category="fixed" width="2" label="16-bit two's-complement integer in network byte order"/>] */
    if (output_byte(encoder_output, context, 0x61) != 0)
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failed encoding short constructor");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}